

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_upto_last_wal_flush_bid_check(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  size_t sVar2;
  ulong uVar3;
  char *__format;
  uint uVar4;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers_out;
  uint64_t num_markers;
  fdb_kvs_handle *db;
  fdb_kvs_config local_458;
  timeval __test_begin;
  fdb_config local_430;
  char keybuf [256];
  char valuebuf [512];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  local_430.num_keeping_headers = 0x14;
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&dbfile,"compact_test",&local_430);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xdc5);
    compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xdc5,"void compact_upto_last_wal_flush_bid_check()");
  }
  fVar1 = fdb_kvs_open(dbfile,&db,"db",&local_458);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xdc8);
    compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xdc8,"void compact_upto_last_wal_flush_bid_check()");
  }
  memset(valuebuf,0x78,200);
  uVar4 = 0;
  while (uVar4 != 0x14) {
    uVar3 = 0;
    while ((int)uVar3 != 1000) {
      sprintf(keybuf,"k%06d",uVar3);
      sprintf(valuebuf,"v%d_%04d",(ulong)uVar4,uVar3);
      handle = db;
      sVar2 = strlen(keybuf);
      fVar1 = fdb_set_kv(handle,keybuf,sVar2 + 1,valuebuf,200);
      uVar3 = (ulong)((int)uVar3 + 1);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xdd0);
        compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xdd0,"void compact_upto_last_wal_flush_bid_check()");
      }
    }
    fVar1 = fdb_commit(dbfile,'\x01');
    uVar4 = uVar4 + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xdd3);
      compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xdd3,"void compact_upto_last_wal_flush_bid_check()");
    }
  }
  fVar1 = fdb_get_all_snap_markers(dbfile,&markers_out,&num_markers);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xdda);
    compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xdda,"void compact_upto_last_wal_flush_bid_check()");
  }
  fVar1 = fdb_compact_upto(dbfile,"compact_test2",markers_out[0xf].marker);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_free_snap_markers(markers_out,num_markers);
    fVar1 = fdb_get_all_snap_markers(dbfile,&markers_out,&num_markers);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xde3);
      compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xde3,"void compact_upto_last_wal_flush_bid_check()");
    }
    fVar1 = fdb_compact_upto(dbfile,"compact_test3",markers_out[0xf].marker);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_free_snap_markers(markers_out,num_markers);
      fVar1 = fdb_close(dbfile);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (compact_upto_last_wal_flush_bid_check()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"compact upto last WAL flush bid check test");
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xded);
      compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xded,"void compact_upto_last_wal_flush_bid_check()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xde8);
    compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xde8,"void compact_upto_last_wal_flush_bid_check()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xdde);
  compact_upto_last_wal_flush_bid_check()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xdde,"void compact_upto_last_wal_flush_bid_check()");
}

Assistant:

void compact_upto_last_wal_flush_bid_check()
{
    TEST_INIT();
    int i, j;
    int r;
    int ndocs=1000;
    int ncommit=20;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[512];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.num_keeping_headers = 20;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(valuebuf, 'x', 200);
    for (i=0; i<ncommit; ++i) {
        for (j=0; j<ndocs; ++j) {
            sprintf(keybuf, "k%06d", j);
            sprintf(valuebuf, "v%d_%04d", i, j);
            s = fdb_set_kv(db, keybuf, strlen(keybuf)+1, valuebuf, 200);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
        s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    fdb_snapshot_info_t *markers_out;
    uint64_t num_markers;

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // compact_upto() will copy DB headers to be kept
    s = fdb_compact_upto(dbfile, "compact_test2", markers_out[15].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // call compact_upto() again
    // copying the previous DB headers should be done correctly.
    s = fdb_compact_upto(dbfile, "compact_test3", markers_out[15].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    memleak_end();

    TEST_RESULT("compact upto last WAL flush bid check test");
}